

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,ExpressionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ExpressionKind EVar1;
  TimingControl *timing;
  Type *this;
  bool bVar2;
  int iVar3;
  SubroutineKind SVar4;
  undefined4 extraout_var;
  ExpressionStatement *pEVar5;
  Diagnostic *this_01;
  AssignmentExpression *ae;
  string_view arg;
  SourceRange local_40;
  CallExpression *this_00;
  
  if (((stmtCtx->flags).m_bits & 8) != 0) {
    slang::syntax::BinaryExpressionSyntax::isKind((((syntax->expr).ptr)->super_SyntaxNode).kind);
  }
  iVar3 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0x108);
  this_00 = (CallExpression *)CONCAT44(extraout_var,iVar3);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pEVar5 = BumpAllocator::
           emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                     (&compilation->super_BumpAllocator,(Expression *)this_00,&local_40);
  bVar2 = Expression::bad((Expression *)this_00);
  if (!bVar2) {
    EVar1 = (this_00->super_Expression).kind;
    if ((int)EVar1 < 0x15) {
      if (EVar1 == UnaryOp) {
        if (*(int *)&(this_00->subroutine).
                     super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     .
                     super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     ._M_u - 10U < 4) {
          return &pEVar5->super_Statement;
        }
      }
      else if (EVar1 == Assignment) {
        if (*(char *)((long)&(this_00->subroutine).
                             super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                     + 0x20) != '\0') {
          return &pEVar5->super_Statement;
        }
        timing = *(TimingControl **)
                  ((long)&(this_00->subroutine).
                          super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                  + 8);
        if (timing == (TimingControl *)0x0) {
          return &pEVar5->super_Statement;
        }
        Statement::StatementContext::observeTiming(stmtCtx,timing);
        return &pEVar5->super_Statement;
      }
    }
    else {
      if (EVar1 == NewClass) {
        return &pEVar5->super_Statement;
      }
      if (EVar1 == Call) {
        SVar4 = CallExpression::getSubroutineKind(this_00);
        this = (this_00->super_Expression).type.ptr;
        if (this->canonical == (Type *)0x0) {
          Type::resolveCanonical(this);
        }
        if (SVar4 != Function) {
          return &pEVar5->super_Statement;
        }
        if ((this->canonical->super_Symbol).kind == VoidType) {
          return &pEVar5->super_Statement;
        }
        this_01 = ASTContext::addDiag(context,(DiagCode)0x5e0008,
                                      (this_00->super_Expression).sourceRange);
        arg = CallExpression::getSubroutineName(this_00);
        Diagnostic::operator<<(this_01,arg);
        return &pEVar5->super_Statement;
      }
    }
    ASTContext::addDiag(context,(DiagCode)0x190008,(this_00->super_Expression).sourceRange);
  }
  pEVar5 = (ExpressionStatement *)Statement::badStmt(compilation,&pEVar5->super_Statement);
  return &pEVar5->super_Statement;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const ExpressionStatementSyntax& syntax,
                                           const ASTContext& context, StatementContext& stmtCtx) {
    bitmask<ASTFlags> extraFlags = ASTFlags::AssignmentAllowed | ASTFlags::TopLevelStatement;
    if (stmtCtx.flags.has(StatementFlags::InForLoop) &&
        BinaryExpressionSyntax::isKind(syntax.expr->kind) &&
        !compilation.hasFlag(CompilationFlags::StrictDriverChecking)) {
        extraFlags |= ASTFlags::NotADriver;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    // Only a subset of expressions are allowed as statements.
    bool ok;
    switch (expr.kind) {
        case ExpressionKind::Call: {
            auto subKind = expr.as<CallExpression>().getSubroutineKind();
            if (!expr.type->isVoid() && subKind == SubroutineKind::Function) {
                context.addDiag(diag::UnusedResult, expr.sourceRange)
                    << expr.as<CallExpression>().getSubroutineName();
            }
            ok = true;
            break;
        }
        case ExpressionKind::Assignment: {
            const AssignmentExpression& ae = expr.as<AssignmentExpression>();
            if (ae.isBlocking() && ae.timingControl)
                stmtCtx.observeTiming(*ae.timingControl);

            ok = true;
            break;
        }
        case ExpressionKind::NewClass:
            ok = true;
            break;
        case ExpressionKind::UnaryOp: {
            auto& unary = expr.as<UnaryExpression>();
            ok = unary.op == UnaryOperator::Preincrement ||
                 unary.op == UnaryOperator::Predecrement ||
                 unary.op == UnaryOperator::Postincrement ||
                 unary.op == UnaryOperator::Postdecrement;
            break;
        }
        default:
            ok = false;
            break;
    }

    if (!ok) {
        context.addDiag(diag::ExprNotStatement, expr.sourceRange);
        return badStmt(compilation, result);
    }

    return *result;
}